

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::add_sample
          (TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *this,double t,
          vector<float,_std::allocator<float>_> *v)

{
  Sample s;
  Sample local_38;
  
  local_38.value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_38._25_8_ = 0;
  local_38.value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_38.value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_38.t = t;
  ::std::vector<float,_std::allocator<float>_>::operator=(&local_38.value,v);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample>>
              *)this,&local_38);
  this->_dirty = true;
  ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&local_38.value.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }